

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O0

void __thiscall
Random_keys::cruzamento5
          (Random_keys *this,RK_Individual *pai1,RK_Individual *pai2,RK_Individual *filho)

{
  int iVar1;
  result_type __s;
  size_type sVar2;
  double *pdVar3;
  reference ppCVar4;
  double dVar5;
  ulong local_60;
  unsigned_long i_2;
  unsigned_long i_1;
  unsigned_long i;
  int tam04;
  int tam;
  __normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
  local_38;
  __normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
  local_30;
  RK_Individual *local_28;
  RK_Individual *filho_local;
  RK_Individual *pai2_local;
  RK_Individual *pai1_local;
  Random_keys *this_local;
  
  local_28 = filho;
  filho_local = pai2;
  pai2_local = pai1;
  pai1_local = (RK_Individual *)this;
  local_30._M_current =
       (Chromosome **)
       std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::begin(&RK_Individual::cromossomos);
  local_38._M_current =
       (Chromosome **)
       std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::end(&RK_Individual::cromossomos);
  __s = time((time_t *)0x0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&tam04,__s);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            (local_30,local_38,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&tam04);
  sVar2 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::size
                    (&RK_Individual::cromossomos);
  dVar5 = round((double)(int)sVar2 * 0.4);
  iVar1 = (int)dVar5;
  for (i_1 = 0; i_1 < (ulong)(long)iVar1; i_1 = i_1 + 1) {
    pdVar3 = RK_Individual::getWeights(pai2_local);
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,i_1);
    dVar5 = pdVar3[(*ppCVar4)->position];
    pdVar3 = RK_Individual::getWeights(local_28);
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,i_1);
    pdVar3[(*ppCVar4)->position] = dVar5;
  }
  i_2 = (unsigned_long)iVar1;
  while( true ) {
    sVar2 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::size
                      (&RK_Individual::cromossomos);
    if (sVar2 - (long)iVar1 <= i_2) break;
    pdVar3 = RK_Individual::getWeights(filho_local);
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,i_2);
    dVar5 = pdVar3[(*ppCVar4)->position];
    pdVar3 = RK_Individual::getWeights(local_28);
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,i_2);
    pdVar3[(*ppCVar4)->position] = dVar5;
    i_2 = i_2 + 1;
  }
  sVar2 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::size
                    (&RK_Individual::cromossomos);
  local_60 = sVar2 - (long)iVar1;
  while( true ) {
    sVar2 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::size
                      (&RK_Individual::cromossomos);
    if (sVar2 <= local_60) break;
    iVar1 = rand();
    pdVar3 = RK_Individual::getWeights(local_28);
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,local_60);
    pdVar3[(*ppCVar4)->position] = (double)(iVar1 % 100);
    local_60 = local_60 + 1;
  }
  return;
}

Assistant:

void Random_keys::cruzamento5(RK_Individual *pai1, RK_Individual *pai2, RK_Individual *filho) {
    shuffle(RK_Individual::cromossomos.begin(), RK_Individual::cromossomos.end(), std::default_random_engine(time(NULL)));

    int tam = RK_Individual::cromossomos.size();

    int tam04 = round(0.4*tam);

    //40% vem do pai1
    for(unsigned long int i=0; i<tam04; i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = pai1->getWeights()[RK_Individual::cromossomos.at(i)->position];

    //40% vem do pai12
    for(unsigned long int i=tam04; i<RK_Individual::cromossomos.size()-tam04; i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = pai2->getWeights()[RK_Individual::cromossomos.at(i)->position];

    //20% gerado de forma aleatoria
    for(unsigned long int i=RK_Individual::cromossomos.size()-tam04; i<RK_Individual::cromossomos.size(); i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = rand() % 100;

}